

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O2

void decompressBlockETC21BitAlphaC
               (uint block_part1,uint block_part2,uint8 *img,uint8 *alphaimg,int width,int height,
               int startx,int starty,int channelsRGB)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int x;
  int iVar4;
  int iVar5;
  int iVar6;
  uint8 *alpha;
  uint block57_part2;
  uint block57_part1;
  ulong local_38;
  
  local_38 = (ulong)(uint)channelsRGB;
  alpha = img + 3;
  if (channelsRGB == 3) {
    alpha = alphaimg;
  }
  uVar3 = ((int)(block_part1 << 5) >> 0x1d) + (block_part1 >> 0x1b);
  uVar1 = ((int)(block_part1 << 0x15) >> 0x1d) + (block_part1 >> 0xb & 0x1f);
  if ((block_part1 & 2) == 0) {
    if (uVar3 < 0x20) {
      if (((int)(block_part1 << 0xd) >> 0x1d) + (block_part1 >> 0x13 & 0x1f) < 0x20) {
        if (uVar1 < 0x20) {
          decompressBlockDifferentialWithAlphaC
                    (block_part1,block_part2,img,alpha,width,height,startx,starty,channelsRGB);
          return;
        }
        iVar2 = width;
        unstuff57bits(block_part1,block_part2,&block57_part1,&block57_part2);
        decompressBlockPlanar57c
                  (block57_part1,block57_part2,img,width,iVar2,startx,starty,(int)local_38);
        iVar2 = startx + 4;
        iVar4 = starty * width + startx;
        for (; iVar6 = starty, iVar5 = iVar4, startx < iVar2; startx = startx + 1) {
          for (; iVar6 < starty + 4; iVar6 = iVar6 + 1) {
            alpha[iVar5 << (channelsRGB != 3) * '\x02'] = 0xff;
            iVar5 = iVar5 + width;
          }
          iVar4 = iVar4 + 1;
        }
      }
      else {
        decompressBlockTHUMB58HAlphaC
                  (block_part1 >> 1 & 0x1fffe |
                   block_part1 >> 2 & 0x60000 | block_part1 & 1 | block_part1 >> 5 & 0x3f80000,
                   block_part2,img,alpha,width,height,startx,starty,channelsRGB);
      }
    }
    else {
      decompressBlockTHUMB59TAlphaC
                (block_part1 >> 2 & 0x6000000 | block_part1 & 1 | block_part1 >> 1 & 0x1fffffe,
                 block_part2,img,alpha,width,height,startx,starty,channelsRGB);
    }
  }
  else {
    if (uVar3 < 0x20) {
      if (((int)(block_part1 << 0xd) >> 0x1d) + (block_part1 >> 0x13 & 0x1f) < 0x20) {
        if (uVar1 < 0x20) {
          decompressBlockDifferentialWithAlphaC
                    (block_part1,block_part2,img,alpha,width,height,startx,starty,channelsRGB);
        }
        else {
          iVar2 = width;
          unstuff57bits(block_part1,block_part2,&block57_part1,&block57_part2);
          decompressBlockPlanar57c
                    (block57_part1,block57_part2,img,width,iVar2,startx,starty,channelsRGB);
        }
      }
      else {
        decompressBlockTHUMB58Hc
                  (block_part1 >> 1 & 0x1fffe |
                   block_part1 >> 2 & 0x60000 | block_part1 & 1 | block_part1 >> 5 & 0x3f80000,
                   block_part2,img,width,width,startx,starty,channelsRGB);
      }
    }
    else {
      decompressBlockTHUMB59Tc
                (block_part1 >> 2 & 0x6000000 | block_part1 & 1 | block_part1 >> 1 & 0x1fffffe,
                 block_part2,img,width,width,startx,starty,channelsRGB);
    }
    iVar2 = startx + 4;
    iVar4 = starty * width + startx;
    for (; iVar6 = starty, iVar5 = iVar4, startx < iVar2; startx = startx + 1) {
      for (; iVar6 < starty + 4; iVar6 = iVar6 + 1) {
        alpha[iVar5 << (channelsRGB != 3) * '\x02'] = 0xff;
        iVar5 = iVar5 + width;
      }
      iVar4 = iVar4 + 1;
    }
  }
  return;
}

Assistant:

void decompressBlockETC21BitAlphaC(unsigned int block_part1, unsigned int block_part2, uint8 *img, uint8* alphaimg, int width, int height, int startx, int starty, int channelsRGB)
{
	int diffbit;
	signed char color1[3];
	signed char diff[3];
	signed char red, green, blue;
  int channelsA;	

  if(channelsRGB == 3)
  {
    // We will decode the alpha data to a separate memory area. 
    channelsA = 1;
  }
  else
  {
    // We will decode the RGB data and the alpha data to the same memory area, 
    // interleaved as RGBA. 
    channelsA = 4;
    alphaimg = &img[0+3];
  }

	diffbit = (GETBITSHIGH(block_part1, 1, 33));

	if( diffbit )
	{
		// We have diffbit = 1, meaning no transparent pixels. regular decompression.

		// Base color
		color1[0]= GETBITSHIGH(block_part1, 5, 63);
		color1[1]= GETBITSHIGH(block_part1, 5, 55);
		color1[2]= GETBITSHIGH(block_part1, 5, 47);

		// Diff color
		diff[0]= GETBITSHIGH(block_part1, 3, 58);
		diff[1]= GETBITSHIGH(block_part1, 3, 50);
		diff[2]= GETBITSHIGH(block_part1, 3, 42);

		// Extend sign bit to entire byte. 
		diff[0] = (diff[0] << 5);
		diff[1] = (diff[1] << 5);
		diff[2] = (diff[2] << 5);
		diff[0] = diff[0] >> 5;
		diff[1] = diff[1] >> 5;
		diff[2] = diff[2] >> 5;

		red   = color1[0] + diff[0];
		green = color1[1] + diff[1];
		blue  = color1[2] + diff[2];

		if(red < 0 || red > 31)
		{
			unsigned int block59_part1, block59_part2;
			unstuff59bits(block_part1, block_part2, block59_part1, block59_part2);
			decompressBlockTHUMB59Tc(block59_part1, block59_part2, img, width, height, startx, starty, channelsRGB);
		}
		else if (green < 0 || green > 31)
		{
			unsigned int block58_part1, block58_part2;
			unstuff58bits(block_part1, block_part2, block58_part1, block58_part2);
			decompressBlockTHUMB58Hc(block58_part1, block58_part2, img, width, height, startx, starty, channelsRGB);
		}
		else if(blue < 0 || blue > 31)
		{
			unsigned int block57_part1, block57_part2;

			unstuff57bits(block_part1, block_part2, block57_part1, block57_part2);
			decompressBlockPlanar57c(block57_part1, block57_part2, img, width, height, startx, starty, channelsRGB);
		}
		else
		{
 			decompressBlockDifferentialWithAlphaC(block_part1, block_part2, img, alphaimg, width, height, startx, starty, channelsRGB);
		}
		for(int x=startx; x<startx+4; x++) 
		{
			for(int y=starty; y<starty+4; y++) 
			{
				alphaimg[channelsA*(x+y*width)]=255;
			}
		}
	}
	else
	{
		// We have diffbit = 0, transparent pixels. Only T-, H- or regular diff-mode possible.
		
		// Base color
		color1[0]= GETBITSHIGH(block_part1, 5, 63);
		color1[1]= GETBITSHIGH(block_part1, 5, 55);
		color1[2]= GETBITSHIGH(block_part1, 5, 47);

		// Diff color
		diff[0]= GETBITSHIGH(block_part1, 3, 58);
		diff[1]= GETBITSHIGH(block_part1, 3, 50);
		diff[2]= GETBITSHIGH(block_part1, 3, 42);

		// Extend sign bit to entire byte. 
		diff[0] = (diff[0] << 5);
		diff[1] = (diff[1] << 5);
		diff[2] = (diff[2] << 5);
		diff[0] = diff[0] >> 5;
		diff[1] = diff[1] >> 5;
		diff[2] = diff[2] >> 5;

		red   = color1[0] + diff[0];
		green = color1[1] + diff[1];
		blue  = color1[2] + diff[2];
		if(red < 0 || red > 31)
		{
			unsigned int block59_part1, block59_part2;
			unstuff59bits(block_part1, block_part2, block59_part1, block59_part2);
			decompressBlockTHUMB59TAlphaC(block59_part1, block59_part2, img, alphaimg, width, height, startx, starty, channelsRGB);
		}
		else if(green < 0 || green > 31) 
		{
			unsigned int block58_part1, block58_part2;
			unstuff58bits(block_part1, block_part2, block58_part1, block58_part2);
			decompressBlockTHUMB58HAlphaC(block58_part1, block58_part2, img, alphaimg, width, height, startx, starty, channelsRGB);
		}
		else if(blue < 0 || blue > 31)
		{
			unsigned int block57_part1, block57_part2;

			unstuff57bits(block_part1, block_part2, block57_part1, block57_part2);
			decompressBlockPlanar57c(block57_part1, block57_part2, img, width, height, startx, starty, channelsRGB);
			for(int x=startx; x<startx+4; x++) 
			{
				for(int y=starty; y<starty+4; y++) 
				{
					alphaimg[channelsA*(x+y*width)]=255;
				}
			}
		}
		else
			decompressBlockDifferentialWithAlphaC(block_part1, block_part2, img,alphaimg, width, height, startx, starty, channelsRGB);
	}
}